

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallbackFederate.cpp
# Opt level: O0

void __thiscall
helics::CallbackFederate::CallbackFederate
          (CallbackFederate *this,string_view fedName,FederateInfo *fedInfo)

{
  string_view fedName_00;
  CombinationFederate *in_RDI;
  FederateInfo *in_stack_00000018;
  Federate *in_stack_00000020;
  size_t in_stack_00000028;
  CallbackFederate *in_stack_00000030;
  function<std::pair<TimeRepresentation<count_time<9,_long>_>,_helics::IterationRequest>_(helics::iteration_time)>
  *this_00;
  FederateInfo *in_stack_ffffffffffffff90;
  void **in_stack_ffffffffffffff98;
  string_view in_stack_ffffffffffffffa8;
  
  fedName_00._M_str = (char *)in_stack_00000030;
  fedName_00._M_len = in_stack_00000028;
  Federate::Federate(in_stack_00000020,fedName_00,in_stack_00000018);
  helics::CombinationFederate::CombinationFederate
            (in_RDI,in_stack_ffffffffffffff98,in_stack_ffffffffffffffa8,in_stack_ffffffffffffff90);
  (in_RDI->super_ValueFederate)._vptr_ValueFederate = (_func_int **)0xa46698;
  *(undefined8 *)&(in_RDI->super_ValueFederate).field_0x98 = 0xa467c0;
  *(undefined8 *)&(in_RDI->super_ValueFederate).field_0x10 = 0xa466f8;
  this_00 = (function<std::pair<TimeRepresentation<count_time<9,_long>_>,_helics::IterationRequest>_(helics::iteration_time)>
             *)&(in_RDI->super_ValueFederate).field_0x20;
  std::shared_ptr<helics::CallbackFederateOperator>::shared_ptr
            ((shared_ptr<helics::CallbackFederateOperator> *)0x3bd30a);
  (in_RDI->super_ValueFederate).field_0x30 = 0;
  std::function<helics::IterationRequest_()>::function
            ((function<helics::IterationRequest_()> *)this_00);
  std::
  function<std::pair<TimeRepresentation<count_time<9,_long>_>,_helics::IterationRequest>_(helics::iteration_time)>
  ::function(this_00);
  std::function<TimeRepresentation<count_time<9,_long>_>_(TimeRepresentation<count_time<9,_long>_>)>
  ::function((function<TimeRepresentation<count_time<9,_long>_>_(TimeRepresentation<count_time<9,_long>_>)>
              *)this_00);
  loadOperator(in_stack_00000030);
  return;
}

Assistant:

CallbackFederate::CallbackFederate(std::string_view fedName, const FederateInfo& fedInfo):
    Federate(fedName, fedInfo), CombinationFederate(fedName, fedInfo)
{
    loadOperator();
}